

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radefs_p.h
# Opt level: O3

Error __thiscall
asmjit::RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_>::nonOverlappingUnionOf
          (RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *this,ZoneAllocator *allocator,
          RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *x,
          RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *y,DataType *yData)

{
  String *pSVar1;
  uint *puVar2;
  Error EVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  char c;
  uint *puVar9;
  String *this_00;
  size_type sVar10;
  uint *puVar11;
  
  uVar4 = (x->_data).super_ZoneVectorBase._size;
  sVar10 = (y->_data).super_ZoneVectorBase._size;
  if ((this->_data).super_ZoneVectorBase._capacity < sVar10 + uVar4) {
    EVar3 = ZoneVectorBase::_reserve((ZoneVectorBase *)this,allocator,0xc,sVar10 + uVar4);
    if (EVar3 != 0) {
      return EVar3;
    }
    uVar4 = (x->_data).super_ZoneVectorBase._size;
    sVar10 = (y->_data).super_ZoneVectorBase._size;
  }
  puVar2 = (uint *)(this->_data).super_ZoneVectorBase._data;
  this_00 = (String *)(x->_data).super_ZoneVectorBase._data;
  puVar8 = (uint *)(y->_data).super_ZoneVectorBase._data;
  pSVar1 = (String *)((long)&this_00->field_0 + (ulong)uVar4 * 0xc);
  puVar9 = puVar8 + (ulong)sVar10 * 3;
  puVar6 = puVar2;
  if (sVar10 != 0 && uVar4 != 0) {
    uVar4 = *(uint *)&this_00->field_0;
    puVar7 = puVar8;
    puVar11 = puVar2;
    do {
      while (uVar5 = puVar7[1], uVar4 < uVar5) {
        uVar4 = *puVar7;
        while (uVar5 = *(uint *)((long)&this_00->field_0 + 4), uVar5 <= uVar4) {
          puVar6 = puVar11 + 3;
          *puVar11 = *(uint *)&this_00->field_0;
          puVar11[1] = uVar5;
          puVar11[2] = *(uint *)((long)&this_00->field_0 + 8);
          this_00 = (String *)((long)&this_00->field_0 + 0xc);
          puVar8 = puVar7;
          puVar11 = puVar6;
          if (this_00 == pSVar1) goto LAB_00121b3f;
        }
        uVar4 = *(uint *)&this_00->field_0;
        if (uVar4 < puVar7[1]) {
          return 0xffffffff;
        }
      }
      *puVar11 = *puVar7;
      puVar11[1] = uVar5;
      puVar11[2] = yData->id;
      puVar11 = puVar11 + 3;
      puVar7 = puVar7 + 3;
      puVar8 = puVar9;
      puVar6 = puVar11;
    } while (puVar7 != puVar9);
  }
  for (; this_00 != pSVar1; this_00 = (String *)((long)&this_00->field_0 + 0xc)) {
    *(undefined8 *)puVar6 = *(undefined8 *)&this_00->field_0;
    puVar6[2] = *(uint *)((long)&this_00->field_0 + 8);
    puVar6 = puVar6 + 3;
  }
LAB_00121b3f:
  if (puVar8 != puVar9) {
    uVar4 = yData->id;
    this_00 = (String *)(ulong)uVar4;
    do {
      *(undefined8 *)puVar6 = *(undefined8 *)puVar8;
      puVar6[2] = uVar4;
      puVar6 = puVar6 + 3;
      puVar8 = puVar8 + 3;
    } while (puVar8 != puVar9);
  }
  if (puVar2 <= puVar6) {
    uVar4 = (this->_data).super_ZoneVectorBase._capacity;
    puVar9 = puVar2 + (ulong)uVar4 * 3;
    if (puVar6 <= puVar9) {
      uVar5 = (int)((ulong)((long)puVar6 - (long)puVar2) >> 2) * -0x55555555;
      if (uVar5 <= uVar4) {
        (this->_data).super_ZoneVectorBase._size = uVar5;
        return 0;
      }
      goto LAB_00121b96;
    }
  }
  RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>>::nonOverlappingUnionOf();
LAB_00121b96:
  c = (char)puVar9;
  RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>>::nonOverlappingUnionOf();
  EVar3 = String::_opChar(this_00,1,c);
  return EVar3;
}

Assistant:

ASMJIT_INLINE Error nonOverlappingUnionOf(ZoneAllocator* allocator, const RALiveSpans<T>& x, const RALiveSpans<T>& y, const DataType& yData) noexcept {
    uint32_t finalSize = x.size() + y.size();
    ASMJIT_PROPAGATE(_data.reserve(allocator, finalSize));

    T* dstPtr = _data.data();
    const T* xSpan = x.data();
    const T* ySpan = y.data();

    const T* xEnd = xSpan + x.size();
    const T* yEnd = ySpan + y.size();

    // Loop until we have intersection or either `xSpan == xEnd` or `ySpan == yEnd`,
    // which means that there is no intersection. We advance either `xSpan` or `ySpan`
    // depending on their ranges.
    if (xSpan != xEnd && ySpan != yEnd) {
      uint32_t xa, ya;
      xa = xSpan->a;
      for (;;) {
        while (ySpan->b <= xa) {
          dstPtr->init(*ySpan, yData);
          dstPtr++;
          if (++ySpan == yEnd)
            goto Done;
        }

        ya = ySpan->a;
        while (xSpan->b <= ya) {
          *dstPtr++ = *xSpan;
          if (++xSpan == xEnd)
            goto Done;
        }

        // We know that `xSpan->b > ySpan->a`, so check if `ySpan->b > xSpan->a`.
        xa = xSpan->a;
        if (ySpan->b > xa)
          return 0xFFFFFFFFu;
      }
    }

  Done:
    while (xSpan != xEnd) {
      *dstPtr++ = *xSpan++;
    }

    while (ySpan != yEnd) {
      dstPtr->init(*ySpan, yData);
      dstPtr++;
      ySpan++;
    }

    _data._setEndPtr(dstPtr);
    return kErrorOk;
  }